

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::Clip_x86_avx2::forward_inplace(Clip_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  _func_int **pp_Var3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  undefined1 (*pauVar13) [32];
  int iVar14;
  float *pfVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  
  uVar2 = bottom_top_blob->c;
  uVar10 = (ulong)uVar2;
  iVar9 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 8) {
    if (0 < (int)uVar2) {
      pp_Var3 = this->_vptr_Clip_x86_avx2;
      uVar11 = 0;
      do {
        if (0 < iVar9) {
          uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var3[-3]);
          auVar17._4_4_ = uVar1;
          auVar17._0_4_ = uVar1;
          auVar17._8_4_ = uVar1;
          auVar17._12_4_ = uVar1;
          auVar17._16_4_ = uVar1;
          auVar17._20_4_ = uVar1;
          auVar17._24_4_ = uVar1;
          auVar17._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
          auVar19._4_4_ = uVar1;
          auVar19._0_4_ = uVar1;
          auVar19._8_4_ = uVar1;
          auVar19._12_4_ = uVar1;
          auVar19._16_4_ = uVar1;
          auVar19._20_4_ = uVar1;
          auVar19._24_4_ = uVar1;
          auVar19._28_4_ = uVar1;
          pauVar13 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar14 = iVar9;
          do {
            auVar8 = vmaxps_avx(auVar19,*pauVar13);
            auVar8 = vminps_avx(auVar8,auVar17);
            *pauVar13 = auVar8;
            pauVar13 = pauVar13 + 1;
            iVar14 = iVar14 + -1;
          } while (iVar14 != 0);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar10);
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar2) {
      pp_Var3 = this->_vptr_Clip_x86_avx2;
      uVar11 = 0;
      do {
        if (0 < iVar9) {
          uVar1 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var3[-3]);
          auVar16._4_4_ = uVar1;
          auVar16._0_4_ = uVar1;
          auVar16._8_4_ = uVar1;
          auVar16._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var3[-3]);
          auVar18._4_4_ = uVar1;
          auVar18._0_4_ = uVar1;
          auVar18._8_4_ = uVar1;
          auVar18._12_4_ = uVar1;
          pauVar12 = (undefined1 (*) [16])
                     (bottom_top_blob->cstep * uVar11 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          iVar14 = iVar9;
          do {
            auVar7 = vmaxps_avx(auVar18,*pauVar12);
            auVar7 = vminps_avx(auVar7,auVar16);
            *pauVar12 = auVar7;
            pauVar12 = pauVar12 + 1;
            iVar14 = iVar14 + -1;
          } while (iVar14 != 0);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar10);
    }
  }
  else if (0 < (int)uVar2) {
    pvVar4 = bottom_top_blob->data;
    sVar5 = bottom_top_blob->cstep;
    pp_Var3 = this->_vptr_Clip_x86_avx2;
    sVar6 = bottom_top_blob->elemsize;
    uVar11 = 0;
    do {
      if (0 < iVar9) {
        pfVar15 = (float *)(sVar5 * sVar6 * uVar11 + (long)pvVar4);
        iVar14 = iVar9 + 1;
        do {
          if (*pfVar15 < *(float *)(&this->field_0xd0 + (long)pp_Var3[-3])) {
            *pfVar15 = *(float *)(&this->field_0xd0 + (long)pp_Var3[-3]);
          }
          if (*(float *)(&this->field_0xd4 + (long)pp_Var3[-3]) < *pfVar15) {
            *pfVar15 = *(float *)(&this->field_0xd4 + (long)pp_Var3[-3]);
          }
          pfVar15 = pfVar15 + 1;
          iVar14 = iVar14 + -1;
        } while (1 < iVar14);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar10);
  }
  return 0;
}

Assistant:

int Clip_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _max = _mm256_set1_ps(max);
            __m256 _min = _mm256_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m256 _ptr = _mm256_loadu_ps(ptr);
                _ptr = _mm256_max_ps(_ptr, _min);
                _ptr = _mm256_min_ps(_ptr, _max);
                _mm256_storeu_ps(ptr, _ptr);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _max = _mm_set1_ps(max);
            __m128 _min = _mm_set1_ps(min);

            for (int i = 0; i < size; i++)
            {
                __m128 _ptr = _mm_loadu_ps(ptr);
                _ptr = _mm_max_ps(_ptr, _min);
                _ptr = _mm_min_ps(_ptr, _max);
                _mm_storeu_ps(ptr, _ptr);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int remain = size;
        for (; remain > 0; remain--)
        {
            if (*ptr < min)
                *ptr = min;

            if (*ptr > max)
                *ptr = max;

            ptr++;
        }
    }

    return 0;
}